

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * __thiscall roaring::Roaring64Map::operator^=(Roaring64Map *this,Roaring64Map *other)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> _Var2;
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>,_bool> pVar3;
  Roaring *self_bitmap;
  bool insert_happened;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> self_iter;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>,_bool> insert_result
  ;
  Roaring *other_bitmap;
  pair<const_unsigned_int,_roaring::Roaring> *other_entry;
  const_iterator __end2;
  const_iterator __begin2;
  roarings_t *__range2;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  iterator in_stack_ffffffffffffff78;
  _Base_ptr in_stack_ffffffffffffff80;
  _Self local_30;
  _Self local_28 [4];
  Roaring64Map *local_8;
  
  if (in_RDI == in_RSI) {
    std::
    map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::clear((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             *)0x124018);
    local_8 = in_RDI;
  }
  else {
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::begin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::end((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    while (bVar1 = std::operator!=(local_28,&local_30), local_8 = in_RDI, bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator*
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)in_RDI
                );
      pVar3 = std::
              map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              ::insert((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                        *)in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78._M_node)
      ;
      _Var2 = pVar3.first._M_node;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x1240d2);
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        Roaring::operator^=((Roaring *)in_RDI,
                            (Roaring *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                           );
        bVar1 = Roaring::isEmpty((Roaring *)in_RDI);
        if (bVar1) {
          in_stack_ffffffffffffff78 =
               std::
               map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
               ::erase_abi_cxx11_(&in_RDI->roarings,in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff80 = _Var2._M_node;
        }
      }
      else {
        Roaring::setCopyOnWrite((Roaring *)in_RDI,(bool)in_stack_ffffffffffffff6f);
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)in_RDI
                );
    }
  }
  return local_8;
}

Assistant:

Roaring64Map &operator^=(const Roaring64Map &other) {
        if (this == &other) {
            // XORing *this with itself results in the empty map.
            roarings.clear();
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self ^ other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  non-empty       Copy other to self and set flags
        // present  absent   unchanged       None
        // present  present  empty or not    XOR other into self, but erase self
        //                                   if result is empty.
        //
        // Because there is only work to do when a key is present in 'other',
        // the main for loop iterates over entries in 'other'.

        for (const auto &other_entry : other.roarings) {
            const auto &other_bitmap = other_entry.second;

            // Try to insert other_bitmap into self at other_key. We take
            // advantage of the fact that std::map::insert will not overwrite an
            // existing entry.
            auto insert_result = roarings.insert(other_entry);
            auto self_iter = insert_result.first;
            auto insert_happened = insert_result.second;
            auto &self_bitmap = self_iter->second;

            if (insert_happened) {
                // Key was not present in self, so insert was performed above.
                // In the logic table above, this reflects the case
                // (self.absent ^ other.present). Because the copy has already
                // happened, thanks to the 'insert' operation above, we just
                // need to set the copyOnWrite flag.
                self_bitmap.setCopyOnWrite(copyOnWrite);
                continue;
            }

            // Both sides have self_key, and the insert was not performed. In
            // the logic table above, this reflects the case
            // (self.present ^ other.present). So XOR other into self.
            self_bitmap ^= other_bitmap;

            if (self_bitmap.isEmpty()) {
                // ...but if intersection is empty, remove it altogether.
                roarings.erase(self_iter);
            }
        }
        return *this;
    }